

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_no_value_t<cfgfile::string_trait_t>::on_string
          (tag_no_value_t<cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  exception_t<cfgfile::string_trait_t> *this_00;
  allocator<char> local_28d;
  allocator<char> local_28c;
  allocator<char> local_28b;
  allocator<char> local_28a;
  allocator<char> local_289;
  string local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>(local_168,"Tag \"",&local_289);
  std::__cxx11::string::string((string *)&local_148,local_168);
  std::operator+(&local_128,&local_148,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a8,"\" doesn\'t allow any values. But we\'ve got this: \"",&local_28a);
  std::__cxx11::string::string((string *)&local_188,local_1a8);
  std::operator+(&local_108,&local_128,&local_188);
  std::operator+(&local_e8,&local_108,str);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"\". In file \"",&local_28b);
  std::__cxx11::string::string((string *)&local_1c8,local_1e8);
  std::operator+(&local_c8,&local_e8,&local_1c8);
  std::operator+(&local_a8,&local_c8,&info->m_file_name);
  std::__cxx11::string::string<std::allocator<char>>(local_228,"\" on line ",&local_28c);
  std::__cxx11::string::string((string *)&local_208,local_228);
  std::operator+(&local_88,&local_a8,&local_208);
  std::__cxx11::to_string(&local_248,info->m_line_number);
  std::operator+(&local_68,&local_88,&local_248);
  std::__cxx11::string::string<std::allocator<char>>(local_288,".",&local_28d);
  std::__cxx11::string::string((string *)&local_268,local_288);
  std::operator+(&local_48,&local_68,&local_268);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_48);
  __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		throw exception_t< Trait >( Trait::from_ascii( "Tag \"" ) +
			this->name() + Trait::from_ascii( "\" doesn't allow any values. "
				"But we've got this: \"" ) +
			str + Trait::from_ascii( "\". In file \"" ) + info.file_name() +
			Trait::from_ascii( "\" on line " ) +
			Trait::to_string( info.line_number() ) +
			Trait::from_ascii( "." ) );
	}